

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scomplex.c
# Opt level: O0

void c_div(singlecomplex *c,singlecomplex *a,singlecomplex *b)

{
  float fVar1;
  float local_38;
  float local_34;
  float ci;
  float cr;
  float abi;
  float abr;
  float den;
  float ratio;
  singlecomplex *b_local;
  singlecomplex *a_local;
  singlecomplex *c_local;
  
  cr = b->r;
  if (cr < 0.0) {
    cr = -cr;
  }
  ci = b->i;
  if (ci < 0.0) {
    ci = -ci;
  }
  if (ci < cr) {
    fVar1 = b->i / b->r;
    local_38 = b->r * (fVar1 * fVar1 + 1.0);
    local_34 = (a->i * fVar1 + a->r) / local_38;
    local_38 = (-a->r * fVar1 + a->i) / local_38;
  }
  else {
    if ((ci == 0.0) && (!NAN(ci))) {
      fprintf(_stderr,"z_div.c: division by zero\n");
      exit(-1);
    }
    fVar1 = b->r / b->i;
    local_38 = b->i * (fVar1 * fVar1 + 1.0);
    local_34 = (a->r * fVar1 + a->i) / local_38;
    local_38 = (a->i * fVar1 + -a->r) / local_38;
  }
  c->r = local_34;
  c->i = local_38;
  return;
}

Assistant:

void c_div(singlecomplex *c, const singlecomplex *a, const singlecomplex *b)
{
    float ratio, den;
    float abr, abi, cr, ci;
  
    if( (abr = b->r) < 0.)
	abr = - abr;
    if( (abi = b->i) < 0.)
	abi = - abi;
    if( abr <= abi ) {
	if (abi == 0) {
	    fprintf(stderr, "z_div.c: division by zero\n");
            exit(-1);
	}	  
	ratio = b->r / b->i ;
	den = b->i * (1 + ratio*ratio);
	cr = (a->r*ratio + a->i) / den;
	ci = (a->i*ratio - a->r) / den;
    } else {
	ratio = b->i / b->r ;
	den = b->r * (1 + ratio*ratio);
	cr = (a->r + a->i*ratio) / den;
	ci = (a->i - a->r*ratio) / den;
    }
    c->r = cr;
    c->i = ci;
}